

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::markPropagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  byte *pbVar1;
  int in_ESI;
  value_type_conflict2 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  value_type_conflict2 *__x;
  
  __x = in_RDI;
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                      (long)in_ESI);
  if (*pbVar1 < 2) {
    std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,__x);
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                        (long)in_ESI);
    *pbVar1 = *pbVar1 | 4;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::markPropagateConflict(
    HighsInt conflict) {
  if (conflictFlag_[conflict] < 2) {
    propagateConflictInds_.push_back(conflict);
    conflictFlag_[conflict] |= 4;
  }
}